

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator>
* __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
::equal_range<int>(pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator>
                   *__return_storage_ptr__,
                  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
                  *this,key_arg<int> *key)

{
  undefined1 auVar1 [16];
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator>
  *ppVar2;
  iterator it;
  SharedLock m;
  iterator local_78;
  iterator local_48;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*key;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
  ::find<int,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
            (&local_78,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
              *)this,key,
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),(DoNothing *)&local_48);
  if (local_78.inner_ == (Inner *)0x0) {
    (__return_storage_ptr__->first).it_end_.ctrl_ = local_78.it_end_.ctrl_;
    (__return_storage_ptr__->first).it_end_.field_1 = local_78.it_end_.field_1;
    (__return_storage_ptr__->first).it_.ctrl_ = local_78.it_.ctrl_;
    (__return_storage_ptr__->first).it_.field_1 = local_78.it_.field_1;
    (__return_storage_ptr__->first).inner_ = (Inner *)0x0;
    (__return_storage_ptr__->first).inner_end_ = local_78.inner_end_;
    ppVar2 = (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator>
              *)&__return_storage_ptr__->second;
  }
  else {
    local_48.it_end_.ctrl_ = local_78.it_end_.ctrl_;
    local_48.it_end_.field_1 = local_78.it_end_.field_1;
    local_48.it_.ctrl_ = local_78.it_.ctrl_;
    local_48.it_.field_1 = local_78.it_.field_1;
    local_48.inner_ = local_78.inner_;
    local_48.inner_end_ = local_78.inner_end_;
    iterator::operator++(&local_48);
    (__return_storage_ptr__->second).inner_ = local_48.inner_;
    (__return_storage_ptr__->second).inner_end_ = local_48.inner_end_;
    (__return_storage_ptr__->second).it_.ctrl_ = local_48.it_.ctrl_;
    (__return_storage_ptr__->second).it_.field_1 = local_48.it_.field_1;
    (__return_storage_ptr__->second).it_end_.ctrl_ = local_48.it_end_.ctrl_;
    (__return_storage_ptr__->second).it_end_.field_1 = local_48.it_end_.field_1;
    ppVar2 = __return_storage_ptr__;
  }
  (ppVar2->first).it_end_.ctrl_ = local_78.it_end_.ctrl_;
  (ppVar2->first).it_end_.field_1 = local_78.it_end_.field_1;
  (ppVar2->first).it_.ctrl_ = local_78.it_.ctrl_;
  (ppVar2->first).it_.field_1 = local_78.it_.field_1;
  (ppVar2->first).inner_ = local_78.inner_;
  (ppVar2->first).inner_end_ = local_78.inner_end_;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> equal_range(const key_arg<K>& key) {
        auto it = find(key);
        if (it != end()) return {it, std::next(it)};
        return {it, it};
    }